

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropagatorTest.cpp
# Opt level: O1

string * __thiscall
jaegertracing::propagation::(anonymous_namespace)::
randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(*(long *)this * 0x41a7) % 0x7fffffff;
  *(ulong *)this = uVar3;
  uVar2 = (uVar3 / 10) * 10;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar3 - (char)uVar2);
  if (uVar3 != uVar2) {
    uVar2 = 0;
    do {
      uVar1 = (ulong)(*(long *)this * 0x41a7) % 0x7fffffff;
      *(ulong *)this = uVar1;
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] =
           "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar1 % 0x3e];
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar3 % 10);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string randomStr(RandomGenerator& gen)
{
    constexpr auto kMaxSize = 10;
    static constexpr char kLetters[] =
        "abcdefghijklmnopqrstuvwxyz"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "0123456789";
    constexpr auto kNumLetters = sizeof(kLetters) - 1;
    const auto size = gen() % kMaxSize;
    std::string result(size, '\0');
    for (auto i = static_cast<size_t>(0); i < size; ++i) {
        const auto pos = gen() % kNumLetters;
        result[i] = kLetters[pos];
    }
    return result;
}